

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::
     VectorArgMinMaxBase<duckdb::GreaterThan,true,(duckdb::OrderType)3,duckdb::SpecializedGenericArgMinMaxState>
     ::
     Combine<duckdb::ArgMinMaxState<duckdb::string_t,int>,duckdb::VectorArgMinMaxBase<duckdb::GreaterThan,true,(duckdb::OrderType)3,duckdb::SpecializedGenericArgMinMaxState>>
               (ArgMinMaxState<duckdb::string_t,_int> *source,
               ArgMinMaxState<duckdb::string_t,_int> *target,AggregateInputData *param_3)

{
  string_t new_value;
  bool bVar1;
  byte *in_RSI;
  byte *in_RDI;
  string_t *unaff_retaddr;
  undefined8 in_stack_00000008;
  
  if (((*in_RDI & 1) != 0) &&
     (((*in_RSI & 1) == 0 ||
      (bVar1 = GreaterThan::Operation<int>((int *)(in_RDI + 0x18),(int *)(in_RSI + 0x18)), bVar1))))
  {
    ArgMinMaxStateBase::AssignValue<int>((int *)(in_RSI + 0x18),*(int *)(in_RDI + 0x18));
    in_RSI[1] = in_RDI[1] & 1;
    if ((in_RSI[1] & 1) == 0) {
      new_value.value.pointer.ptr = (char *)param_3;
      new_value.value._0_8_ = in_stack_00000008;
      ArgMinMaxStateBase::AssignValue<duckdb::string_t>(unaff_retaddr,new_value);
    }
    *in_RSI = 1;
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_initialized) {
			return;
		}
		if (!target.is_initialized || COMPARATOR::Operation(source.value, target.value)) {
			STATE::template AssignValue<typename STATE::BY_TYPE>(target.value, source.value);
			target.arg_null = source.arg_null;
			if (!target.arg_null) {
				STATE::template AssignValue<typename STATE::ARG_TYPE>(target.arg, source.arg);
			}
			target.is_initialized = true;
		}
	}